

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O2

void __thiscall RandomizerWorld::load_model_from_json(RandomizerWorld *this,bool lite_mode)

{
  load_additional_item_data(this);
  load_item_sources(this,lite_mode);
  load_nodes(this);
  load_paths(this);
  load_regions(this);
  load_spawn_locations(this);
  load_hint_sources(this);
  load_teleport_trees(this);
  return;
}

Assistant:

void RandomizerWorld::load_model_from_json(bool lite_mode)
{
    this->load_additional_item_data();
    this->load_item_sources(lite_mode);
    this->load_nodes();
    this->load_paths();
    this->load_regions();
    this->load_spawn_locations();
    this->load_hint_sources();
    this->load_teleport_trees();
}